

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

err_t rngESRead(size_t *read,void *buf,size_t count,char *source)

{
  u32 *puVar1;
  int iVar2;
  bool_t bVar3;
  long lVar4;
  code *pcVar5;
  undefined4 *puVar6;
  tm_ticks_t tVar7;
  tm_ticks_t tVar8;
  FILE *__stream;
  size_t sVar9;
  undefined4 uVar10;
  long lVar11;
  err_t eVar12;
  ulong uVar13;
  char cVar14;
  bool bVar15;
  octet ok;
  u32 local_54;
  u32 local_50;
  u32 local_4c;
  size_t local_40;
  size_t *local_38;
  
  iVar2 = strCmp(source,"trng");
  if (iVar2 == 0) {
    puVar1 = (u32 *)cpuid_basic_info(0);
    _ok = *puVar1;
    local_54 = puVar1[1];
    local_4c = puVar1[2];
    local_50 = puVar1[3];
    *read = 0;
    bVar3 = rngCPUIDIsManufId((u32 *)&ok,"GenuineIntel");
    if ((bVar3 == 0) && (bVar3 = rngCPUIDIsManufId((u32 *)&ok,"AuthenticAMD"), bVar3 == 0)) {
      return 0xca;
    }
    lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar11 + 4) >> 0x12 & 1) == 0) {
      return 0xca;
    }
    if (count < 4) {
      return 0;
    }
    uVar13 = *read;
    puVar6 = (undefined4 *)buf;
    while (uVar13 + 4 <= count) {
      uVar10 = rdseed();
      cVar14 = rdseedIsValid();
      *puVar6 = uVar10;
      if (cVar14 == '\0') goto LAB_0010f84f;
      uVar13 = *read + 4;
      *read = uVar13;
      puVar6 = puVar6 + 1;
    }
    if (count <= uVar13) {
      return 0;
    }
    uVar10 = rdseed();
    cVar14 = rdseedIsValid();
  }
  else {
    iVar2 = strCmp(source,"trng2");
    if (iVar2 != 0) {
      iVar2 = strCmp(source,"timer");
      local_40 = count;
      if (iVar2 == 0) {
        tVar7 = tmFreq();
        if (tVar7 < 1000000000) {
          return 0xca;
        }
        local_38 = read;
        for (sVar9 = 0; sVar9 != local_40; sVar9 = sVar9 + 1) {
          *(undefined1 *)((long)buf + sVar9) = 0;
          tVar7 = tmTicks();
          for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
            uVar13 = 0;
            lVar4 = 8;
            while (bVar15 = lVar4 != 0, lVar4 = lVar4 + -1, bVar15) {
              mtSleep(0);
              tVar8 = tmTicks();
              uVar13 = uVar13 ^ tVar8 - tVar7;
              tVar7 = tVar8;
            }
            bVar3 = u64Parity(uVar13);
            *(byte *)((long)buf + sVar9) =
                 *(byte *)((long)buf + sVar9) ^ (byte)(bVar3 << ((byte)lVar11 & 0x1f));
          }
        }
        *local_38 = local_40;
      }
      else {
        iVar2 = strCmp(source,"sys");
        if (iVar2 == 0) {
          __stream = (FILE *)fileOpen("/dev/urandom","rb");
          if (__stream == (FILE *)0x0) {
            return 0xcb;
          }
          sVar9 = fileRead2(buf,count,(file_t)__stream);
          *read = sVar9;
          fclose(__stream);
        }
        else {
          iVar2 = strCmp(source,"sys2");
          if (iVar2 != 0) {
            return 0xca;
          }
          lVar11 = 0;
          do {
            if (lVar11 == 0x10) {
              return 0xca;
            }
            lVar4 = dlopen((long)&DAT_0013a37c + (long)*(int *)((long)&DAT_0013a37c + lVar11),2);
            lVar11 = lVar11 + 4;
          } while (lVar4 == 0);
          *read = 0;
          pcVar5 = (code *)dlsym(lVar4,"RAND_bytes");
          sVar9 = local_40;
          if ((pcVar5 == (code *)0x0) || (iVar2 = (*pcVar5)(buf,local_40 & 0xffffffff), iVar2 != 1))
          {
            dlclose(lVar4);
            return 0x70;
          }
          dlclose(lVar4);
          *read = sVar9;
        }
      }
      return 0;
    }
    puVar1 = (u32 *)cpuid_basic_info(0);
    _ok = *puVar1;
    local_54 = puVar1[1];
    local_4c = puVar1[2];
    local_50 = puVar1[3];
    *read = 0;
    bVar3 = rngCPUIDIsManufId((u32 *)&ok,"GenuineIntel");
    if ((bVar3 == 0) && (bVar3 = rngCPUIDIsManufId((u32 *)&ok,"AuthenticAMD"), bVar3 == 0)) {
      return 0xca;
    }
    lVar11 = cpuid_Version_info(1);
    if ((*(uint *)(lVar11 + 0xc) >> 0x1e & 1) == 0) {
      return 0xca;
    }
    if (count < 4) {
      return 0;
    }
    uVar13 = *read;
    puVar6 = (undefined4 *)buf;
    while (uVar13 + 4 <= count) {
      uVar10 = rdrand();
      cVar14 = rdrandIsValid();
      *puVar6 = uVar10;
      if (cVar14 == '\0') goto LAB_0010f84f;
      uVar13 = *read + 4;
      *read = uVar13;
      puVar6 = puVar6 + 1;
    }
    if (count <= uVar13) {
      return 0;
    }
    uVar10 = rdrand();
    cVar14 = rdrandIsValid();
  }
  eVar12 = 0;
  *(undefined4 *)((long)buf + (count - 4)) = uVar10;
  if (cVar14 == '\0') {
LAB_0010f84f:
    eVar12 = 0x12e;
  }
  else {
    *read = count;
  }
  return eVar12;
}

Assistant:

err_t rngESRead(size_t* read, void* buf, size_t count, const char* source)
{
	if (strEq(source, "trng"))
		return rngTRNGRead(buf, read, count);
	else if (strEq(source, "trng2"))
		return rngTRNG2Read(buf, read, count);
	else if (strEq(source, "timer"))
		return rngTimerRead(buf, read, count);
	else if (strEq(source, "sys"))
		return rngSysRead(buf, read, count);
	else if (strEq(source, "sys2"))
		return rngSys2Read(buf, read, count);
	return ERR_FILE_NOT_FOUND;
}